

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetNavID(ImGuiID id,int nav_layer)

{
  ImGuiContext *pIVar1;
  bool local_19;
  ImGuiContext *g;
  int nav_layer_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x81b,"void SetNavID(ImGuiID, int)");
  }
  local_19 = 1 < (uint)nav_layer;
  if (local_19) {
    __assert_fail("nav_layer == 0 || nav_layer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x81c,"void SetNavID(ImGuiID, int)");
  }
  GImGui->NavId = id;
  pIVar1->NavWindow->NavLastIds[nav_layer] = id;
  return;
}

Assistant:

static void SetNavID(ImGuiID id, int nav_layer)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}